

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Ptr<Catch::IStreamingReporter>
Catch::addListeners(Ptr<const_Catch::IConfig> *config,Ptr<Catch::IStreamingReporter> *reporters)

{
  bool bVar1;
  int iVar2;
  IRegistryHub *pIVar3;
  undefined4 extraout_var;
  iterator additionalReporter;
  reference this;
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  *in_RDI;
  const_iterator itEnd;
  const_iterator it;
  Listeners listeners;
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  *in_stack_ffffffffffffff58;
  ReporterConfig *in_stack_ffffffffffffff60;
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  *other;
  Ptr<Catch::IStreamingReporter> *in_stack_ffffffffffffff80;
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  *in_stack_ffffffffffffffa8;
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  *in_stack_ffffffffffffffb0;
  Ptr<Catch::IStreamingReporter> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_Catch::Ptr<Catch::IReporterFactory>_*,_std::vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>_>
  local_38 [7];
  
  other = in_RDI;
  pIVar3 = getRegistryHub();
  iVar2 = (*pIVar3->_vptr_IRegistryHub[2])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x20))();
  std::
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  ::vector(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  ::begin(in_stack_ffffffffffffff58);
  __gnu_cxx::
  __normal_iterator<Catch::Ptr<Catch::IReporterFactory>const*,std::vector<Catch::Ptr<Catch::IReporterFactory>,std::allocator<Catch::Ptr<Catch::IReporterFactory>>>>
  ::__normal_iterator<Catch::Ptr<Catch::IReporterFactory>*>
            ((__normal_iterator<const_Catch::Ptr<Catch::IReporterFactory>_*,_std::vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>_>
              *)in_stack_ffffffffffffff60,
             (__normal_iterator<Catch::Ptr<Catch::IReporterFactory>_*,_std::vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>_>
              *)in_stack_ffffffffffffff58);
  additionalReporter =
       std::
       vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
       ::end(in_stack_ffffffffffffff58);
  __gnu_cxx::
  __normal_iterator<Catch::Ptr<Catch::IReporterFactory>const*,std::vector<Catch::Ptr<Catch::IReporterFactory>,std::allocator<Catch::Ptr<Catch::IReporterFactory>>>>
  ::__normal_iterator<Catch::Ptr<Catch::IReporterFactory>*>
            ((__normal_iterator<const_Catch::Ptr<Catch::IReporterFactory>_*,_std::vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>_>
              *)in_stack_ffffffffffffff60,
             (__normal_iterator<Catch::Ptr<Catch::IReporterFactory>_*,_std::vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>_>
              *)in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::Ptr<Catch::IReporterFactory>_*,_std::vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>_>
                        *)in_stack_ffffffffffffff60,
                       (__normal_iterator<const_Catch::Ptr<Catch::IReporterFactory>_*,_std::vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>_>
                        *)in_stack_ffffffffffffff58);
    if (!bVar1) break;
    this = __gnu_cxx::
           __normal_iterator<const_Catch::Ptr<Catch::IReporterFactory>_*,_std::vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>_>
           ::operator*(local_38);
    in_stack_ffffffffffffff60 = (ReporterConfig *)Ptr<Catch::IReporterFactory>::operator->(this);
    ReporterConfig::ReporterConfig
              (in_stack_ffffffffffffff60,(Ptr<const_Catch::IConfig> *)in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff58 =
         (vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
          *)(**(code **)(in_stack_ffffffffffffff60->m_stream + 0x20))
                      (in_stack_ffffffffffffff60,&stack0xffffffffffffff80);
    Ptr<Catch::IStreamingReporter>::Ptr
              ((Ptr<Catch::IStreamingReporter> *)in_stack_ffffffffffffff60,
               (IStreamingReporter *)in_stack_ffffffffffffff58);
    addReporter(in_stack_ffffffffffffffb8,
                (Ptr<Catch::IStreamingReporter> *)additionalReporter._M_current);
    Ptr<Catch::IStreamingReporter>::operator=
              (in_stack_ffffffffffffff80,(Ptr<Catch::IStreamingReporter> *)other);
    Ptr<Catch::IStreamingReporter>::~Ptr
              ((Ptr<Catch::IStreamingReporter> *)in_stack_ffffffffffffff60);
    Ptr<Catch::IStreamingReporter>::~Ptr
              ((Ptr<Catch::IStreamingReporter> *)in_stack_ffffffffffffff60);
    ReporterConfig::~ReporterConfig((ReporterConfig *)0x1797c4);
    __gnu_cxx::
    __normal_iterator<const_Catch::Ptr<Catch::IReporterFactory>_*,_std::vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>_>
    ::operator++(local_38);
  }
  Ptr<Catch::IStreamingReporter>::Ptr
            ((Ptr<Catch::IStreamingReporter> *)in_stack_ffffffffffffff60,
             (Ptr<Catch::IStreamingReporter> *)in_stack_ffffffffffffff58);
  std::
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  ::~vector(in_RDI);
  return (Ptr<Catch::IStreamingReporter>)(IStreamingReporter *)other;
}

Assistant:

Ptr<IStreamingReporter> addListeners( Ptr<IConfig const> const& config, Ptr<IStreamingReporter> reporters ) {
        IReporterRegistry::Listeners listeners = getRegistryHub().getReporterRegistry().getListeners();
        for( IReporterRegistry::Listeners::const_iterator it = listeners.begin(), itEnd = listeners.end();
                it != itEnd;
                ++it )
            reporters = addReporter(reporters, (*it)->create( ReporterConfig( config ) ) );
        return reporters;
    }